

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall
cmConfigureLog::WriteLiteralTextBlock(cmConfigureLog *this,string_view key,string_view text)

{
  char *first;
  uchar c;
  ofstream *poVar1;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint c32;
  cmConfigureLog *local_40;
  value_type *e;
  
  pcVar6 = text._M_str;
  uVar4 = text._M_len;
  poVar1 = BeginLine(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,key._M_str,
                      key._M_len);
  std::operator<<(poVar2,": |");
  poVar1 = &this->Stream;
  std::endl<char,std::char_traits<char>>
            (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
  if (uVar4 != 0) {
    this->Indent = this->Indent + 1;
    BeginLine(this);
    e = pcVar6 + uVar4;
    uVar5 = 0;
    local_40 = this;
LAB_0041e3f2:
    if (uVar5 < uVar4) {
      c = pcVar6[uVar5];
      if (c == '\t') {
LAB_0041e474:
        std::ostream::put((char)poVar1);
        uVar5 = uVar5 + 1;
      }
      else if (c == '\n') {
        uVar5 = uVar5 + 1;
        if (uVar5 < uVar4) {
          std::endl<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
          BeginLine(this);
        }
      }
      else if (c == '\\') {
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\\\\");
        uVar5 = uVar5 + 1;
      }
      else {
        if (c != '\r') {
          if ((byte)(c - 0x20) < 0x5f) goto LAB_0041e474;
          if ((char)c < '\0') {
            first = pcVar6 + uVar5;
            pcVar3 = cm_utf8_decode_character(first,e,&c32);
            this = local_40;
            if ((first <= pcVar3 && (long)pcVar3 - (long)first != 0) && (0x9f < c32)) {
              std::ostream::write((char *)poVar1,(long)first);
              uVar5 = uVar5 + ((long)pcVar3 - (long)first & 0xffffffffU);
              this = local_40;
              goto LAB_0041e3f2;
            }
          }
          WriteEscape(this,c);
          uVar5 = uVar5 + 1;
          goto LAB_0041e3f2;
        }
        uVar5 = uVar5 + 1;
        if ((uVar5 == uVar4) || (pcVar6[uVar5] != '\n')) {
          WriteEscape(this,'\r');
        }
      }
      goto LAB_0041e3f2;
    }
    std::endl<char,std::char_traits<char>>
              (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
    this->Indent = this->Indent - 1;
  }
  return;
}

Assistant:

void cmConfigureLog::WriteLiteralTextBlock(cm::string_view key,
                                           cm::string_view text)
{
  this->BeginLine() << key << ": |";
  this->EndLine();

  auto const l = text.length();
  if (l) {
    ++this->Indent;
    this->BeginLine();

    auto i = decltype(l){ 0 };
    while (i < l) {
      // YAML allows ' ', '\t' and "printable characters", but NOT other
      // ASCII whitespace; those must be escaped, as must the upper UNICODE
      // control characters (U+0080 - U+009F)
      static constexpr unsigned int C1_LAST = 0x9F;
      auto const c = static_cast<unsigned char>(text[i]);
      switch (c) {
        case '\r':
          // Print a carriage return only if it is not followed by a line feed.
          ++i;
          if (i == l || text[i] != '\n') {
            this->WriteEscape(c);
          }
          break;
        case '\n':
          // Print any line feeds except the very last one
          if (i + 1 < l) {
            this->EndLine();
            this->BeginLine();
          }
          ++i;
          break;
        case '\t':
          // Print horizontal tab verbatim
          this->Stream.put('\t');
          ++i;
          break;
        case '\\':
          // Escape backslash for disambiguation
          this->Stream << "\\\\";
          ++i;
          break;
        default:
          if (c >= 32 && c < 127) {
            // Print ascii byte.
            this->Stream.put(text[i]);
            ++i;
            break;
          } else if (c > 127) {
            // Decode a UTF-8 sequence.
            unsigned int c32;
            auto const* const s = text.data() + i;
            auto const* const e = text.data() + l;
            auto const* const n = cm_utf8_decode_character(s, e, &c32);
            if (n > s && c32 > C1_LAST) {
              auto const k = std::distance(s, n);
              this->Stream.write(s, static_cast<std::streamsize>(k));
              i += static_cast<unsigned>(k);
              break;
            }
          }

          // Escape non-printable byte.
          this->WriteEscape(c);
          ++i;
          break;
      }
    }

    this->EndLine();
    --this->Indent;
  }
}